

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementShellANCF_3423::Layer::SetupInitial(Layer *this)

{
  ChElementShellANCF_3423 *pCVar1;
  double dVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  double dVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_ZMM26 [64];
  double local_f8;
  double local_b8;
  double local_a8;
  
  uVar4 = &stack0xfffffffffffffff8 < (undefined1 *)0x140;
  pCVar1 = this->m_element;
  auVar15._0_8_ = -2.0 / pCVar1->m_lenX;
  auVar15._8_8_ = 0xc000000000000000;
  auVar28 = ZEXT816(0x3fd0000000000000);
  auVar5 = vmulsd_avx512f(auVar15,auVar28);
  auVar6 = vxorpd_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = pCVar1->m_thickness;
  auVar7 = vmulsd_avx512f(auVar6,auVar7);
  dVar27 = auVar7._0_8_ * 0.5 * 0.25;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar27;
  auVar8 = vmulsd_avx512f(auVar15,auVar13);
  auVar12._0_8_ = 2.0 / pCVar1->m_lenX;
  auVar12._8_8_ = 0;
  auVar9 = vmulsd_avx512f(auVar12,auVar28);
  auVar10 = vmulsd_avx512f(auVar12,auVar13);
  dVar32 = -2.0 / pCVar1->m_lenY;
  dVar59 = dVar32 * 0.25;
  dVar32 = dVar32 * dVar27;
  dVar33 = 2.0 / pCVar1->m_lenY;
  dVar2 = dVar33 * 0.25;
  dVar33 = dVar33 * dVar27;
  auVar11 = vmovddup_avx512vl(auVar5);
  auVar7 = *(undefined1 (*) [16])
            (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
            m_data.array;
  auVar12 = vmulpd_avx512vl(auVar7,auVar11);
  auVar13 = vmovddup_avx512vl(auVar8);
  auVar21 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 3);
  auVar14 = vfmadd231pd_avx512vl(auVar12,auVar13,auVar21);
  auVar15 = vmovddup_avx512vl(auVar9);
  auVar12 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 6);
  auVar16 = vfmadd231pd_avx512vl(auVar14,auVar15,auVar12);
  auVar17 = vmovddup_avx512vl(auVar10);
  auVar14 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 9);
  auVar18 = vfmadd231pd_avx512vl(auVar16,auVar17,auVar14);
  auVar16 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xc);
  auVar18 = vfmadd231pd_avx512vl(auVar18,auVar16,auVar15);
  auVar15 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xf);
  auVar18 = vfmadd231pd_avx512vl(auVar18,auVar15,auVar17);
  auVar17 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x12);
  auVar18 = vfmadd231pd_avx512vl(auVar18,auVar17,auVar11);
  auVar11 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x15);
  auVar13 = vfmadd231pd_avx512vl(auVar18,auVar11,auVar13);
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[2];
  auVar18 = vmulsd_avx512f(auVar5,auVar79);
  dVar27 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[5];
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar27;
  auVar19 = vmulsd_avx512f(auVar8,auVar80);
  auVar18 = vaddsd_avx512f(auVar18,auVar19);
  dVar34 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[8];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar34;
  auVar19 = vmulsd_avx512f(auVar9,auVar81);
  auVar50._0_8_ =
       (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0xb];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = auVar50._0_8_;
  auVar20 = vmulsd_avx512f(auVar10,auVar82);
  auVar19 = vaddsd_avx512f(auVar19,auVar20);
  auVar18 = vaddsd_avx512f(auVar18,auVar19);
  auVar61._0_8_ =
       (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0xe];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = auVar61._0_8_;
  auVar9 = vmulsd_avx512f(auVar9,auVar84);
  dVar40 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x11];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar40;
  auVar10 = vmulsd_avx512f(auVar10,auVar86);
  auVar9 = vaddsd_avx512f(auVar9,auVar10);
  dVar45 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x14];
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar45;
  auVar5 = vmulsd_avx512f(auVar5,auVar90);
  dVar58 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x17];
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar58;
  auVar8 = vmulsd_avx512f(auVar8,auVar94);
  auVar5 = vaddsd_avx512f(auVar5,auVar8);
  auVar5 = vaddsd_avx512f(auVar9,auVar5);
  auVar5 = vaddsd_avx512f(auVar18,auVar5);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar59;
  auVar8 = vmovddup_avx512vl(auVar65);
  auVar9 = vmulpd_avx512vl(auVar7,auVar8);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar32;
  auVar10 = vmovddup_avx512vl(auVar75);
  auVar9 = vfmadd231pd_avx512vl(auVar9,auVar10,auVar21);
  auVar8 = vfmadd231pd_avx512vl(auVar9,auVar12,auVar8);
  auVar8 = vfmadd231pd_avx512vl(auVar8,auVar14,auVar10);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2;
  auVar9 = vmovddup_avx512vl(auVar18);
  auVar8 = vfmadd231pd_avx512vl(auVar8,auVar9,auVar16);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar33;
  auVar10 = vmovddup_avx512vl(auVar20);
  auVar8 = vfmadd231pd_avx512vl(auVar8,auVar10,auVar15);
  auVar8 = vfmadd231pd_avx512vl(auVar8,auVar17,auVar9);
  auVar8 = vfmadd231pd_avx512vl(auVar8,auVar11,auVar10);
  auVar9 = vmulsd_avx512f(auVar65,auVar79);
  auVar10 = vmulsd_avx512f(auVar75,auVar80);
  auVar9 = vaddsd_avx512f(auVar9,auVar10);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar32;
  auVar10 = vmulsd_avx512f(auVar76,auVar82);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar59 * dVar34 + auVar10._0_8_;
  auVar9 = vaddsd_avx512f(auVar9,auVar66);
  auVar10 = vmulsd_avx512f(auVar18,auVar84);
  auVar18 = vmulsd_avx512f(auVar20,auVar86);
  auVar10 = vaddsd_avx512f(auVar10,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2;
  auVar18 = vmulsd_avx512f(auVar19,auVar90);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar33;
  auVar19 = vmulsd_avx512f(auVar53,auVar94);
  dVar34 = auVar9._0_8_ + auVar10._0_8_ + auVar18._0_8_ + auVar19._0_8_;
  auVar10 = ZEXT816(0);
  auVar67._0_8_ = auVar7._0_8_ * 0.0;
  auVar67._8_8_ = auVar7._8_8_ * 0.0;
  auVar9._8_8_ = 0x3fd0000000000000;
  auVar9._0_8_ = 0x3fd0000000000000;
  auVar7 = vfmadd231pd_fma(auVar67,auVar9,auVar21);
  auVar7 = vfmadd231pd_fma(auVar7,auVar10,auVar12);
  auVar7 = vfmadd231pd_fma(auVar7,auVar9,auVar14);
  auVar7 = vfmadd231pd_fma(auVar7,auVar10,auVar16);
  auVar7 = vfmadd231pd_fma(auVar7,auVar9,auVar15);
  auVar7 = vfmadd231pd_fma(auVar7,auVar17,auVar10);
  auVar12 = vfmadd231pd_fma(auVar7,auVar11,auVar9);
  auVar7 = vmulsd_avx512f(auVar79,auVar6);
  auVar21 = vmulsd_avx512f(auVar81,auVar6);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = auVar50._0_8_;
  auVar14 = vmulsd_avx512f(auVar83,auVar28);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = auVar61._0_8_;
  auVar16 = vmulsd_avx512f(auVar85,auVar6);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar40;
  auVar15 = vmulsd_avx512f(auVar87,auVar28);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar45;
  auVar17 = vmulsd_avx512f(auVar91,auVar6);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar58;
  auVar11 = vmulsd_avx512f(auVar95,auVar28);
  dVar27 = auVar7._0_8_ + dVar27 * 0.25 + auVar21._0_8_ + auVar14._0_8_ +
           auVar16._0_8_ + auVar15._0_8_ + auVar17._0_8_ + auVar11._0_8_;
  auVar15 = vshufpd_avx512vl(auVar8,auVar8,1);
  auVar21 = vmulsd_avx512f(auVar13,auVar15);
  auVar7 = vshufpd_avx(auVar12,auVar12,1);
  auVar14 = vmulsd_avx512f(auVar7,auVar8);
  auVar14 = vmulsd_avx512f(auVar14,auVar5);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar27;
  auVar21 = vfmadd231sd_fma(auVar14,auVar17,auVar21);
  auVar17 = vshufpd_avx512vl(auVar13,auVar13,1);
  dVar58 = auVar17._0_8_;
  dVar59 = auVar12._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar59 * dVar58;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar34;
  auVar21 = vfmadd213sd_fma(auVar14,auVar28,auVar21);
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  auVar11 = vxorpd_avx512vl(auVar5,auVar11);
  dVar45 = auVar15._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar45 * auVar11._0_8_;
  auVar21 = vfmadd231sd_fma(auVar21,auVar60,auVar12);
  dVar40 = auVar7._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar40 * dVar34;
  auVar21 = vfnmadd213sd_avx512f(auVar10,auVar13,auVar21);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar58 * dVar27;
  auVar21 = vfnmadd213sd_avx512f(auVar16,auVar8,auVar21);
  this->m_detJ0C = auVar21._0_8_;
  auVar14 = vfmadd231sd_fma(auVar60,auVar17,auVar28);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar34;
  auVar21 = vmulsd_avx512f(auVar54,auVar13);
  auVar9 = vfmsub231sd_avx512f(auVar21,auVar5,auVar8);
  auVar21 = vmulsd_avx512f(auVar8,auVar17);
  auVar16 = vfmsub231sd_avx512f(auVar21,auVar13,auVar15);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar58 * dVar58;
  auVar21 = vfmadd231sd_avx512f(auVar21,auVar13,auVar13);
  vfmadd231sd_avx512f(auVar21,auVar5,auVar5);
  auVar21 = vucomisd_avx512f(auVar6);
  auVar61._0_8_ = auVar14._0_8_;
  auVar50._0_8_ = auVar16._0_8_;
  if ((bool)uVar4) {
    dVar32 = sqrt(auVar21._0_8_);
    auVar50._8_8_ = 0;
    auVar61._8_8_ = 0;
    auVar6 = vxorpd_avx512vl(auVar6,auVar6);
    auVar16 = auVar50;
    auVar14 = auVar61;
  }
  else {
    auVar21 = vsqrtsd_avx(auVar21,auVar21);
    dVar32 = auVar21._0_8_;
  }
  dVar32 = 1.0 / dVar32;
  local_a8 = auVar13._0_8_;
  dVar2 = dVar32 * local_a8;
  dVar33 = dVar32 * dVar58;
  local_b8 = auVar5._0_8_;
  dVar32 = dVar32 * local_b8;
  local_f8 = auVar9._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_f8 * local_f8;
  auVar21 = vfmadd231sd_fma(auVar29,auVar14,auVar14);
  vfmadd231sd_fma(auVar21,auVar16,auVar16);
  auVar21 = vucomisd_avx512f(auVar6);
  if ((bool)uVar4) {
    dVar24 = sqrt(auVar21._0_8_);
  }
  else {
    auVar21 = vsqrtsd_avx(auVar21,auVar21);
    dVar24 = auVar21._0_8_;
    auVar61._0_8_ = auVar14._0_8_;
    auVar50._0_8_ = auVar16._0_8_;
  }
  bVar3 = 2.2250738585072014e-308 <= dVar24;
  dVar24 = 1.0 / dVar24;
  dVar25 = (double)((ulong)bVar3 * (long)(dVar24 * local_f8));
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar25;
  auVar22._0_8_ =
       (double)((ulong)bVar3 * (long)(dVar24 * auVar61._0_8_) + (ulong)!bVar3 * 0x3ff0000000000000);
  auVar22._8_8_ = 0;
  auVar50._0_8_ = (double)((ulong)bVar3 * (long)(auVar50._0_8_ * dVar24));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar50._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar33;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar32;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar33 * auVar50._0_8_;
  auVar21 = vfmsub231sd_fma(auVar55,auVar6,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar2;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar32 * auVar22._0_8_;
  auVar14 = vfmsub231sd_fma(auVar56,auVar23,auVar36);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar2 * dVar25;
  auVar16 = vfmsub231sd_fma(auVar30,auVar22,auVar51);
  dVar24 = cos(this->m_theta);
  dVar25 = sin(this->m_theta);
  auVar50._0_8_ = dVar25 * auVar21._0_8_ + dVar24 * dVar2;
  auVar61._0_8_ = dVar25 * auVar14._0_8_ + dVar24 * dVar33;
  dVar24 = dVar25 * auVar16._0_8_ + dVar24 * dVar32;
  dVar25 = sin(this->m_theta);
  dVar26 = cos(this->m_theta);
  dVar2 = dVar26 * auVar21._0_8_ - dVar25 * dVar2;
  dVar33 = dVar26 * auVar14._0_8_ - dVar25 * dVar33;
  dVar32 = dVar26 * auVar16._0_8_ - dVar25 * dVar32;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar34;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar27;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar34 * dVar40;
  auVar21 = vfmsub231sd_fma(auVar31,auVar15,auVar46);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar27 * auVar8._0_8_;
  auVar14 = vfmsub231sd_fma(auVar37,auVar77,auVar12);
  auVar21 = vunpcklpd_avx(auVar21,auVar14);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar45 * dVar59;
  auVar14 = vfmsub231sd_fma(auVar38,auVar8,auVar7);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar27 * -dVar58;
  auVar7 = vfmadd231sd_fma(auVar41,auVar7,auVar5);
  auVar14 = vunpcklpd_avx(auVar14,auVar7);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar59 * auVar11._0_8_;
  auVar7 = vfmadd231sd_fma(auVar42,auVar13,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar40 * local_a8;
  auVar12 = vfmsub231sd_fma(auVar47,auVar17,auVar12);
  auVar12 = vunpcklpd_avx(auVar7,auVar12);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar45 * local_b8;
  auVar7 = vfmsub231sd_fma(auVar48,auVar17,auVar77);
  auVar16 = vunpcklpd_avx(auVar7,auVar9);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar58 * auVar8._0_8_;
  auVar15 = vfmsub231sd_fma(auVar52,auVar13,auVar15);
  dVar27 = this->m_detJ0C;
  auVar57._8_8_ = dVar27;
  auVar57._0_8_ = dVar27;
  auVar7 = vdivpd_avx(auVar21,auVar57);
  auVar21 = vdivpd_avx(auVar14,auVar57);
  auVar12 = vdivpd_avx(auVar12,auVar57);
  auVar14 = vdivpd_avx(auVar16,auVar57);
  auVar78._0_8_ = auVar15._0_8_ / dVar27;
  auVar78._8_8_ = auVar15._8_8_;
  auVar16 = vshufpd_avx(auVar21,auVar21,1);
  auVar15 = vshufpd_avx(auVar7,auVar7,1);
  auVar17 = vshufpd_avx(auVar14,auVar14,1);
  auVar11 = vshufpd_avx(auVar12,auVar12,1);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = auVar61._0_8_;
  auVar5 = vmulsd_avx512f(auVar96,auVar15);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = auVar50._0_8_;
  auVar5 = vfmadd231sd_avx512f(auVar5,auVar88,auVar7);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar24;
  auVar8 = vfmadd231sd_avx512f(auVar5,auVar92,auVar21);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar33 * auVar15._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar2;
  auVar5 = vfmadd231sd_fma(auVar49,auVar63,auVar7);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar32;
  auVar5 = vfmadd231sd_fma(auVar5,auVar68,auVar21);
  auVar15 = vmulsd_avx512f(auVar6,auVar15);
  auVar7 = vfmadd231sd_avx512f(auVar15,auVar22,auVar7);
  auVar7 = vfmadd231sd_fma(auVar7,auVar23,auVar21);
  auVar21 = vmulsd_avx512f(auVar96,auVar12);
  auVar21 = vfmadd231sd_avx512f(auVar21,auVar88,auVar16);
  auVar9 = vfmadd231sd_avx512f(auVar21,auVar92,auVar11);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar33 * auVar12._0_8_;
  auVar21 = vfmadd231sd_fma(auVar39,auVar63,auVar16);
  auVar21 = vfmadd231sd_fma(auVar21,auVar68,auVar11);
  auVar12 = vmulsd_avx512f(auVar6,auVar12);
  auVar12 = vfmadd231sd_avx512f(auVar12,auVar22,auVar16);
  auVar12 = vfmadd231sd_fma(auVar12,auVar23,auVar11);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = auVar61._0_8_;
  auVar16 = vmulsd_avx512f(auVar97,auVar17);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = auVar50._0_8_;
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar14,auVar89);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar24;
  auVar11 = vfmadd231sd_avx512f(auVar16,auVar78,auVar93);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = auVar17._0_8_ * dVar33;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar2;
  auVar16 = vfmadd231sd_fma(auVar62,auVar14,auVar64);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar32;
  auVar16 = vfmadd231sd_fma(auVar16,auVar78,auVar69);
  auVar15 = vmulsd_avx512f(auVar6,auVar17);
  auVar14 = vfmadd231sd_avx512f(auVar15,auVar14,auVar22);
  auVar14 = vfmadd231sd_fma(auVar14,auVar23,auVar78);
  auVar50._0_8_ = auVar8._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0] = auVar50._0_8_ * auVar50._0_8_;
  auVar61._0_8_ = auVar5._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [6] = auVar61._0_8_ * auVar61._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xc] = (auVar50._0_8_ + auVar50._0_8_) * auVar61._0_8_;
  dVar45 = auVar7._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x12] = dVar45 * dVar45;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x18] = (auVar50._0_8_ + auVar50._0_8_) * dVar45;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = (auVar61._0_8_ + auVar61._0_8_) * dVar45;
  dVar27 = auVar9._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [1] = dVar27 * dVar27;
  dVar34 = auVar21._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [7] = dVar34 * dVar34;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xd] = (dVar27 + dVar27) * dVar34;
  dVar40 = auVar12._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x13] = dVar40 * dVar40;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x19] = (dVar27 + dVar27) * dVar40;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = (dVar34 + dVar34) * dVar40;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [2] = auVar50._0_8_ * dVar27;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [8] = auVar61._0_8_ * dVar34;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = auVar61._0_8_ * dVar27;
  auVar15 = vfmadd231sd_fma(auVar70,auVar8,auVar21);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xe] = auVar15._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x14] = dVar45 * dVar40;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar45 * dVar27;
  auVar12 = vfmadd231sd_fma(auVar71,auVar8,auVar12);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1a] = auVar12._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = auVar61._0_8_ * dVar40;
  auVar7 = vfmadd231sd_fma(auVar72,auVar7,auVar21);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x20] = auVar7._0_8_;
  dVar58 = auVar11._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [3] = dVar58 * dVar58;
  dVar59 = auVar16._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [9] = dVar59 * dVar59;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xf] = (dVar58 + dVar58) * dVar59;
  dVar32 = auVar14._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x15] = dVar32 * dVar32;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1b] = dVar32 * (dVar58 + dVar58);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x21] = dVar32 * (dVar59 + dVar59);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [4] = auVar50._0_8_ * dVar58;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [10] = auVar61._0_8_ * dVar59;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar58 * auVar61._0_8_;
  auVar7 = vfmadd231sd_fma(auVar73,auVar8,auVar16);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x10] = auVar7._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x16] = dVar32 * dVar45;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar45 * dVar58;
  auVar7 = vfmadd231sd_fma(auVar74,auVar14,auVar8);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1c] = auVar7._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar45 * dVar59;
  auVar7 = vfmadd231sd_fma(auVar8,auVar14,auVar5);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x22] = auVar7._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [5] = dVar27 * dVar58;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xb] = dVar34 * dVar59;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar34 * dVar58;
  auVar7 = vfmadd231sd_fma(auVar43,auVar9,auVar16);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x11] = auVar7._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x17] = dVar32 * dVar40;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar58 * dVar40;
  auVar7 = vfmadd231sd_fma(auVar44,auVar14,auVar9);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1d] = auVar7._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar40 * dVar59;
  auVar7 = vfmadd231sd_fma(auVar5,auVar21,auVar14);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x23] = auVar7._0_8_;
  return;
}

Assistant:

void ChElementShellANCF_3423::Layer::SetupInitial() {
    // Evaluate shape functions at element center
    ChMatrixNM<double, 1, 8> Nx;
    ChMatrixNM<double, 1, 8> Ny;
    ChMatrixNM<double, 1, 8> Nz;
    m_element->ShapeFunctionsDerivativeX(Nx, 0, 0, 0);
    m_element->ShapeFunctionsDerivativeY(Ny, 0, 0, 0);
    m_element->ShapeFunctionsDerivativeZ(Nz, 0, 0, 0);

    ChMatrixNM<double, 1, 3> Nx_d0 = Nx * m_element->m_d0;
    ChMatrixNM<double, 1, 3> Ny_d0 = Ny * m_element->m_d0;
    ChMatrixNM<double, 1, 3> Nz_d0 = Nz * m_element->m_d0;

    // Determinant of position vector gradient matrix: Initial configuration
    m_detJ0C = Nx_d0(0, 0) * Ny_d0(0, 1) * Nz_d0(0, 2) + Ny_d0(0, 0) * Nz_d0(0, 1) * Nx_d0(0, 2) +
               Nz_d0(0, 0) * Nx_d0(0, 1) * Ny_d0(0, 2) - Nx_d0(0, 2) * Ny_d0(0, 1) * Nz_d0(0, 0) -
               Ny_d0(0, 2) * Nz_d0(0, 1) * Nx_d0(0, 0) - Nz_d0(0, 2) * Nx_d0(0, 1) * Ny_d0(0, 0);

    //// Transformation : Orthogonal transformation (A and J) ////
    ChVector<double> G1xG2;  // Cross product of first and second column of
    double G1dotG1;          // Dot product of first column of position vector gradient

    G1xG2.x() = Nx_d0(1) * Ny_d0(2) - Nx_d0(2) * Ny_d0(1);
    G1xG2.y() = Nx_d0(2) * Ny_d0(0) - Nx_d0(0) * Ny_d0(2);
    G1xG2.z() = Nx_d0(0) * Ny_d0(1) - Nx_d0(1) * Ny_d0(0);
    G1dotG1 = Nx_d0(0) * Nx_d0(0) + Nx_d0(1) * Nx_d0(1) + Nx_d0(2) * Nx_d0(2);

    // Tangent Frame
    ChVector<double> A1;
    ChVector<double> A2;
    ChVector<double> A3;
    A1.x() = Nx_d0(0);
    A1.y() = Nx_d0(1);
    A1.z() = Nx_d0(2);
    A1 = A1 / sqrt(G1dotG1);
    A3 = G1xG2.GetNormalized();
    A2.Cross(A3, A1);

    ChVector<double> AA1;
    ChVector<double> AA2;
    ChVector<double> AA3;
    AA1 = A1 * cos(m_theta) + A2 * sin(m_theta);
    AA2 = -A1 * sin(m_theta) + A2 * cos(m_theta);
    AA3 = A3;

    ////Beta
    ChMatrixNM<double, 3, 3> j0;
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    ChVectorN<double, 9> beta;

    j0(0, 0) = Ny_d0(1) * Nz_d0(2) - Nz_d0(1) * Ny_d0(2);
    j0(0, 1) = Ny_d0(2) * Nz_d0(0) - Ny_d0(0) * Nz_d0(2);
    j0(0, 2) = Ny_d0(0) * Nz_d0(1) - Nz_d0(0) * Ny_d0(1);
    j0(1, 0) = Nz_d0(1) * Nx_d0(2) - Nx_d0(1) * Nz_d0(2);
    j0(1, 1) = Nz_d0(2) * Nx_d0(0) - Nx_d0(2) * Nz_d0(0);
    j0(1, 2) = Nz_d0(0) * Nx_d0(1) - Nz_d0(1) * Nx_d0(0);
    j0(2, 0) = Nx_d0(1) * Ny_d0(2) - Ny_d0(1) * Nx_d0(2);
    j0(2, 1) = Ny_d0(0) * Nx_d0(2) - Nx_d0(0) * Ny_d0(2);
    j0(2, 2) = Nx_d0(0) * Ny_d0(1) - Ny_d0(0) * Nx_d0(1);
    j0 /= m_detJ0C;

    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);

    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    // Calculate T0: transformation matrix, function of fiber angle (see Yamashita et al, 2015, JCND)
    m_T0(0, 0) = pow(beta(0), 2);
    m_T0(1, 0) = pow(beta(1), 2);
    m_T0(2, 0) = 2.0 * beta(0) * beta(1);
    m_T0(3, 0) = pow(beta(2), 2);
    m_T0(4, 0) = 2.0 * beta(0) * beta(2);
    m_T0(5, 0) = 2.0 * beta(1) * beta(2);

    m_T0(0, 1) = pow(beta(3), 2);
    m_T0(1, 1) = pow(beta(4), 2);
    m_T0(2, 1) = 2.0 * beta(3) * beta(4);
    m_T0(3, 1) = pow(beta(5), 2);
    m_T0(4, 1) = 2.0 * beta(3) * beta(5);
    m_T0(5, 1) = 2.0 * beta(4) * beta(5);

    m_T0(0, 2) = beta(0) * beta(3);
    m_T0(1, 2) = beta(1) * beta(4);
    m_T0(2, 2) = beta(0) * beta(4) + beta(1) * beta(3);
    m_T0(3, 2) = beta(2) * beta(5);
    m_T0(4, 2) = beta(0) * beta(5) + beta(2) * beta(3);
    m_T0(5, 2) = beta(2) * beta(4) + beta(1) * beta(5);

    m_T0(0, 3) = pow(beta(6), 2);
    m_T0(1, 3) = pow(beta(7), 2);
    m_T0(2, 3) = 2.0 * beta(6) * beta(7);
    m_T0(3, 3) = pow(beta(8), 2);
    m_T0(4, 3) = 2.0 * beta(6) * beta(8);
    m_T0(5, 3) = 2.0 * beta(7) * beta(8);

    m_T0(0, 4) = beta(0) * beta(6);
    m_T0(1, 4) = beta(1) * beta(7);
    m_T0(2, 4) = beta(0) * beta(7) + beta(6) * beta(1);
    m_T0(3, 4) = beta(2) * beta(8);
    m_T0(4, 4) = beta(0) * beta(8) + beta(2) * beta(6);
    m_T0(5, 4) = beta(1) * beta(8) + beta(2) * beta(7);

    m_T0(0, 5) = beta(3) * beta(6);
    m_T0(1, 5) = beta(4) * beta(7);
    m_T0(2, 5) = beta(3) * beta(7) + beta(4) * beta(6);
    m_T0(3, 5) = beta(5) * beta(8);
    m_T0(4, 5) = beta(3) * beta(8) + beta(6) * beta(5);
    m_T0(5, 5) = beta(4) * beta(8) + beta(5) * beta(7);
}